

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O2

void ImFontAtlasBuildFinish(ImFontAtlas *atlas)

{
  ImVector_ImFontPtr *this;
  float fVar1;
  ImVec2 IVar2;
  ushort uVar3;
  uint *puVar4;
  uchar *puVar5;
  uint *puVar6;
  uint uVar7;
  ImFontAtlasCustomRect *pIVar8;
  ImFont **ppIVar9;
  ulong uVar10;
  ulong uVar11;
  int i;
  long lVar12;
  int iVar13;
  int iVar14;
  ulong uVar15;
  unsigned_short uVar16;
  uint uVar17;
  int iVar18;
  uint uVar19;
  ulong uVar20;
  uint uVar21;
  float fVar22;
  ImVec2 local_50;
  ImVec2 local_48;
  ImVec4 *local_40;
  long local_38;
  
  if ((atlas->TexPixelsAlpha8 == (uchar *)0x0) && (atlas->TexPixelsRGBA32 == (uint *)0x0)) {
    __assert_fail("atlas->TexPixelsAlpha8 != __null || atlas->TexPixelsRGBA32 != __null",
                  "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui_draw.cpp"
                  ,0xade,"void ImFontAtlasBuildFinish(ImFontAtlas *)");
  }
  pIVar8 = ImFontAtlas::GetCustomRectByIndex(atlas,atlas->PackIdMouseCursors);
  uVar3 = pIVar8->X;
  if (uVar3 == 0xffff) {
    __assert_fail("r->IsPacked()",
                  "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui_draw.cpp"
                  ,0xa6d,"void ImFontAtlasBuildRenderDefaultTexData(ImFontAtlas *)");
  }
  if ((atlas->Flags & 2) == 0) {
    if ((pIVar8->Width != 0xd9) || (pIVar8->Height != 0x1b)) {
      __assert_fail("r->Width == FONT_ATLAS_DEFAULT_TEX_DATA_W * 2 + 1 && r->Height == FONT_ATLAS_DEFAULT_TEX_DATA_H"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui_draw.cpp"
                    ,0xa73,"void ImFontAtlasBuildRenderDefaultTexData(ImFontAtlas *)");
    }
    if (atlas->TexPixelsAlpha8 == (uchar *)0x0) {
      ImFontAtlasBuildRender32bppRectFromString
                (atlas,(uint)uVar3,(uint)pIVar8->Y,0x6c,0x1b,
                 "..-         -XXXXXXX-    X    -           X           -XXXXXXX          -          XXXXXXX-     XX          ..-         -X.....X-   X.X   -          X.X          -X.....X          -          X.....X-    X..X         ---         -XXX.XXX-  X...X  -         X...X         -X....X           -           X....X-    X..X         X           -  X.X  - X.....X -        X.....X        -X...X            -            X...X-    X..X         XX          -  X.X  -X.......X-       X.......X       -X..X.X           -           X.X..X-    X..X         X.X         -  X.X  -XXXX.XXXX-       XXXX.XXXX       -X.X X.X          -          X.X X.X-    X..XXX       X..X        -  X.X  -   X.X   -          X.X          -XX   X.X         -         X.X   XX-    X..X..XXX    X...X       -  X.X  -   X.X   -    XX    X.X    XX    -      X.X        -        X.X      -    X..X..X..XX  X....X      -  X.X  -   X.X   -   X.X    X.X    X.X   -       X.X       -       X.X       -    X..X..X..X.X X.....X     -  X.X  -   X.X   -  X..X    X.X    X..X  -        X.X      -      X.X        -XXX X..X..X..X..XX......X    -  X.X  -   X.X   - X...XXXXXX.XXXXXX...X -         X.X   XX-XX   X.X         -X..XX........X..XX.......X   -  X.X  -   X.X   -X.....................X-          X.X X.X-X.X X.X          -X...X...........XX........X  -  X.X  -   X.X   - X...XXXXXX.XXXXXX...X -           X.X..X-X..X.X           - X..............XX.........X -XXX.XXX-   X.X   -  X..X    X.X    X..X  -            X...X-X...X            -  X.............XX..........X-X.....X-   X.X   -   X.X    X.X    X.X   -           X....X-X....X           -  X.............XX......XXXXX-XXXXXXX-   X.X   -    XX    X.X    XX    -          X.....X-X.....X          -   X............XX...X..X    ---------   X.X   -          X.X          -          XXXXXXX-XXXXXXX          -   X...........X X..X X..X   -       -XXXX.XXXX-       XXXX.XXXX       -------------------------------------    X..........X X.X  X..X   -       -X.......X-       X.......X       -    XX           XX    -           -    X..........." /* TRUNCATED STRING LITERAL */
                 ,'.',0xffffffff);
      ImFontAtlasBuildRender32bppRectFromString
                (atlas,uVar3 + 0x6d,(uint)pIVar8->Y,0x6c,0x1b,
                 "..-         -XXXXXXX-    X    -           X           -XXXXXXX          -          XXXXXXX-     XX          ..-         -X.....X-   X.X   -          X.X          -X.....X          -          X.....X-    X..X         ---         -XXX.XXX-  X...X  -         X...X         -X....X           -           X....X-    X..X         X           -  X.X  - X.....X -        X.....X        -X...X            -            X...X-    X..X         XX          -  X.X  -X.......X-       X.......X       -X..X.X           -           X.X..X-    X..X         X.X         -  X.X  -XXXX.XXXX-       XXXX.XXXX       -X.X X.X          -          X.X X.X-    X..XXX       X..X        -  X.X  -   X.X   -          X.X          -XX   X.X         -         X.X   XX-    X..X..XXX    X...X       -  X.X  -   X.X   -    XX    X.X    XX    -      X.X        -        X.X      -    X..X..X..XX  X....X      -  X.X  -   X.X   -   X.X    X.X    X.X   -       X.X       -       X.X       -    X..X..X..X.X X.....X     -  X.X  -   X.X   -  X..X    X.X    X..X  -        X.X      -      X.X        -XXX X..X..X..X..XX......X    -  X.X  -   X.X   - X...XXXXXX.XXXXXX...X -         X.X   XX-XX   X.X         -X..XX........X..XX.......X   -  X.X  -   X.X   -X.....................X-          X.X X.X-X.X X.X          -X...X...........XX........X  -  X.X  -   X.X   - X...XXXXXX.XXXXXX...X -           X.X..X-X..X.X           - X..............XX.........X -XXX.XXX-   X.X   -  X..X    X.X    X..X  -            X...X-X...X            -  X.............XX..........X-X.....X-   X.X   -   X.X    X.X    X.X   -           X....X-X....X           -  X.............XX......XXXXX-XXXXXXX-   X.X   -    XX    X.X    XX    -          X.....X-X.....X          -   X............XX...X..X    ---------   X.X   -          X.X          -          XXXXXXX-XXXXXXX          -   X...........X X..X X..X   -       -XXXX.XXXX-       XXXX.XXXX       -------------------------------------    X..........X X.X  X..X   -       -X.......X-       X.......X       -    XX           XX    -           -    X..........." /* TRUNCATED STRING LITERAL */
                 ,'X',0xffffffff);
    }
    else {
      ImFontAtlasBuildRender8bppRectFromString
                (atlas,(uint)uVar3,(uint)pIVar8->Y,0x6c,0x1b,
                 "..-         -XXXXXXX-    X    -           X           -XXXXXXX          -          XXXXXXX-     XX          ..-         -X.....X-   X.X   -          X.X          -X.....X          -          X.....X-    X..X         ---         -XXX.XXX-  X...X  -         X...X         -X....X           -           X....X-    X..X         X           -  X.X  - X.....X -        X.....X        -X...X            -            X...X-    X..X         XX          -  X.X  -X.......X-       X.......X       -X..X.X           -           X.X..X-    X..X         X.X         -  X.X  -XXXX.XXXX-       XXXX.XXXX       -X.X X.X          -          X.X X.X-    X..XXX       X..X        -  X.X  -   X.X   -          X.X          -XX   X.X         -         X.X   XX-    X..X..XXX    X...X       -  X.X  -   X.X   -    XX    X.X    XX    -      X.X        -        X.X      -    X..X..X..XX  X....X      -  X.X  -   X.X   -   X.X    X.X    X.X   -       X.X       -       X.X       -    X..X..X..X.X X.....X     -  X.X  -   X.X   -  X..X    X.X    X..X  -        X.X      -      X.X        -XXX X..X..X..X..XX......X    -  X.X  -   X.X   - X...XXXXXX.XXXXXX...X -         X.X   XX-XX   X.X         -X..XX........X..XX.......X   -  X.X  -   X.X   -X.....................X-          X.X X.X-X.X X.X          -X...X...........XX........X  -  X.X  -   X.X   - X...XXXXXX.XXXXXX...X -           X.X..X-X..X.X           - X..............XX.........X -XXX.XXX-   X.X   -  X..X    X.X    X..X  -            X...X-X...X            -  X.............XX..........X-X.....X-   X.X   -   X.X    X.X    X.X   -           X....X-X....X           -  X.............XX......XXXXX-XXXXXXX-   X.X   -    XX    X.X    XX    -          X.....X-X.....X          -   X............XX...X..X    ---------   X.X   -          X.X          -          XXXXXXX-XXXXXXX          -   X...........X X..X X..X   -       -XXXX.XXXX-       XXXX.XXXX       -------------------------------------    X..........X X.X  X..X   -       -X.......X-       X.......X       -    XX           XX    -           -    X..........." /* TRUNCATED STRING LITERAL */
                 ,'.',0xff);
      ImFontAtlasBuildRender8bppRectFromString
                (atlas,uVar3 + 0x6d,(uint)pIVar8->Y,0x6c,0x1b,
                 "..-         -XXXXXXX-    X    -           X           -XXXXXXX          -          XXXXXXX-     XX          ..-         -X.....X-   X.X   -          X.X          -X.....X          -          X.....X-    X..X         ---         -XXX.XXX-  X...X  -         X...X         -X....X           -           X....X-    X..X         X           -  X.X  - X.....X -        X.....X        -X...X            -            X...X-    X..X         XX          -  X.X  -X.......X-       X.......X       -X..X.X           -           X.X..X-    X..X         X.X         -  X.X  -XXXX.XXXX-       XXXX.XXXX       -X.X X.X          -          X.X X.X-    X..XXX       X..X        -  X.X  -   X.X   -          X.X          -XX   X.X         -         X.X   XX-    X..X..XXX    X...X       -  X.X  -   X.X   -    XX    X.X    XX    -      X.X        -        X.X      -    X..X..X..XX  X....X      -  X.X  -   X.X   -   X.X    X.X    X.X   -       X.X       -       X.X       -    X..X..X..X.X X.....X     -  X.X  -   X.X   -  X..X    X.X    X..X  -        X.X      -      X.X        -XXX X..X..X..X..XX......X    -  X.X  -   X.X   - X...XXXXXX.XXXXXX...X -         X.X   XX-XX   X.X         -X..XX........X..XX.......X   -  X.X  -   X.X   -X.....................X-          X.X X.X-X.X X.X          -X...X...........XX........X  -  X.X  -   X.X   - X...XXXXXX.XXXXXX...X -           X.X..X-X..X.X           - X..............XX.........X -XXX.XXX-   X.X   -  X..X    X.X    X..X  -            X...X-X...X            -  X.............XX..........X-X.....X-   X.X   -   X.X    X.X    X.X   -           X....X-X....X           -  X.............XX......XXXXX-XXXXXXX-   X.X   -    XX    X.X    XX    -          X.....X-X.....X          -   X............XX...X..X    ---------   X.X   -          X.X          -          XXXXXXX-XXXXXXX          -   X...........X X..X X..X   -       -XXXX.XXXX-       XXXX.XXXX       -------------------------------------    X..........X X.X  X..X   -       -X.......X-       X.......X       -    XX           XX    -           -    X..........." /* TRUNCATED STRING LITERAL */
                 ,'X',0xff);
    }
  }
  else {
    if ((pIVar8->Width != 2) || (pIVar8->Height != 2)) {
      __assert_fail("r->Width == 2 && r->Height == 2",
                    "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui_draw.cpp"
                    ,0xa84,"void ImFontAtlasBuildRenderDefaultTexData(ImFontAtlas *)");
    }
    iVar13 = atlas->TexWidth;
    iVar14 = (uint)pIVar8->Y * iVar13 + (uint)uVar3;
    if (atlas->TexPixelsAlpha8 == (uchar *)0x0) {
      puVar4 = atlas->TexPixelsRGBA32;
      puVar6 = puVar4 + (iVar13 + iVar14);
      puVar6[0] = 0xffffffff;
      puVar6[1] = 0xffffffff;
      puVar4 = puVar4 + iVar14;
      puVar4[0] = 0xffffffff;
      puVar4[1] = 0xffffffff;
    }
    else {
      atlas->TexPixelsAlpha8[(long)(iVar13 + iVar14) + 1] = 0xff;
      atlas->TexPixelsAlpha8[iVar13 + iVar14] = 0xff;
      atlas->TexPixelsAlpha8[(long)iVar14 + 1] = 0xff;
      atlas->TexPixelsAlpha8[iVar14] = 0xff;
    }
  }
  uVar17._0_2_ = pIVar8->X;
  uVar17._2_2_ = pIVar8->Y;
  IVar2 = atlas->TexUvScale;
  (atlas->TexUvWhitePixel).x = IVar2.x * ((float)(uVar17 & 0xffff) + 0.5);
  (atlas->TexUvWhitePixel).y = IVar2.y * ((float)(uVar17 >> 0x10) + 0.5);
  if ((atlas->Flags & 4) == 0) {
    pIVar8 = ImFontAtlas::GetCustomRectByIndex(atlas,atlas->PackIdLines);
    uVar16 = pIVar8->X;
    if (uVar16 == 0xffff) {
      __assert_fail("r->IsPacked()",
                    "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui_draw.cpp"
                    ,0xa99,"void ImFontAtlasBuildRenderLinesTexData(ImFontAtlas *)");
    }
    local_40 = atlas->TexUvLines;
    lVar12 = 0;
    iVar13 = 0;
    iVar14 = 0;
    uVar15 = 0;
    while (uVar15 != 0x40) {
      if (pIVar8->Height <= uVar15) {
        __assert_fail("pad_left + line_width + pad_right == r->Width && y < r->Height",
                      "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui_draw.cpp"
                      ,0xaa3,"void ImFontAtlasBuildRenderLinesTexData(ImFontAtlas *)");
      }
      uVar17 = (uint)pIVar8->Width;
      puVar5 = atlas->TexPixelsAlpha8;
      uVar21 = (uint)uVar16;
      if (puVar5 == (uchar *)0x0) {
        puVar6 = atlas->TexPixelsRGBA32;
        uVar19 = (uint)pIVar8->Y;
        uVar20 = (ulong)((iVar13 + uVar19) * atlas->TexWidth + uVar21);
        uVar7 = iVar14 + uVar17 >> 1;
        uVar10 = (ulong)uVar7;
        for (uVar11 = 0; uVar10 != uVar11; uVar11 = uVar11 + 1) {
          puVar6[uVar20 + uVar11] = 0;
        }
        for (uVar11 = 0; uVar15 != uVar11; uVar11 = uVar11 + 1) {
          puVar6[uVar10 + uVar20 + uVar11] = 0xffffffff;
        }
        for (uVar11 = 0; local_38 = lVar12, (iVar14 + uVar17) - uVar7 != uVar11; uVar11 = uVar11 + 1
            ) {
          *(undefined4 *)((long)puVar6 + uVar11 * 4 + lVar12 + uVar10 * 4 + uVar20 * 4) = 0;
        }
      }
      else {
        uVar20 = (ulong)(((uint)pIVar8->Y + iVar13) * atlas->TexWidth + uVar21);
        uVar21 = iVar14 + uVar17 >> 1;
        uVar11 = (ulong)uVar21;
        for (uVar10 = 0; uVar11 != uVar10; uVar10 = uVar10 + 1) {
          puVar5[uVar10 + uVar20] = '\0';
        }
        for (uVar10 = 0; uVar15 != uVar10; uVar10 = uVar10 + 1) {
          puVar5[uVar10 + uVar20 + uVar11] = 0xff;
        }
        for (uVar10 = 0; (iVar14 + uVar17) - uVar21 != uVar10; uVar10 = uVar10 + 1) {
          puVar5[uVar10 + uVar20 + uVar11 + uVar15] = '\0';
        }
        uVar16 = pIVar8->X;
        uVar21 = (uint)uVar16;
        uVar19 = (uint)pIVar8->Y;
      }
      iVar18 = uVar19 + (int)uVar15;
      uVar17 = uVar17 - (int)uVar15 >> 1;
      fVar1 = (atlas->TexUvScale).x;
      fVar22 = (atlas->TexUvScale).y;
      local_40[uVar15].x = (float)((uVar21 + uVar17) - 1) * fVar1;
      fVar22 = ((float)(iVar18 + 1) * fVar22 + (float)iVar18 * fVar22) * 0.5;
      atlas->TexUvLines[uVar15].y = fVar22;
      atlas->TexUvLines[uVar15].z = fVar1 * (float)(uVar21 + uVar17 + (int)(uVar15 + 1));
      atlas->TexUvLines[uVar15].w = fVar22;
      iVar14 = iVar14 + -1;
      iVar13 = iVar13 + 1;
      lVar12 = lVar12 + 4;
      uVar15 = uVar15 + 1;
    }
  }
  iVar13 = 0;
  do {
    if ((atlas->CustomRects).Size <= iVar13) {
      this = &atlas->Fonts;
      for (iVar13 = 0; iVar13 < this->Size; iVar13 = iVar13 + 1) {
        ppIVar9 = ImVector<ImFont_*>::operator[]((ImVector<ImFont_*> *)this,iVar13);
        if ((*ppIVar9)->DirtyLookupTables == true) {
          ppIVar9 = ImVector<ImFont_*>::operator[]((ImVector<ImFont_*> *)this,iVar13);
          ImFont::BuildLookupTable(*ppIVar9);
        }
      }
      atlas->TexReady = true;
      return;
    }
    pIVar8 = ImVector<ImFontAtlasCustomRect>::operator[]
                       ((ImVector<ImFontAtlasCustomRect> *)&atlas->CustomRects,iVar13);
    if ((pIVar8->Font != (ImFont *)0x0) && (pIVar8->GlyphID != 0)) {
      if (pIVar8->Font->ContainerAtlas != (ImFontAtlas_conflict *)atlas) {
        __assert_fail("r->Font->ContainerAtlas == atlas",
                      "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui_draw.cpp"
                      ,0xaea,"void ImFontAtlasBuildFinish(ImFontAtlas *)");
      }
      local_48.x = 0.0;
      local_48.y = 0.0;
      local_50.x = 0.0;
      local_50.y = 0.0;
      ImFontAtlas::CalcCustomRectUV(atlas,pIVar8,&local_48,&local_50);
      fVar1 = (pIVar8->GlyphOffset).x;
      fVar22 = (pIVar8->GlyphOffset).y;
      ImFont::AddGlyph(pIVar8->Font,(ImFontConfig_conflict *)0x0,(ImWchar)pIVar8->GlyphID,fVar1,
                       fVar22,(float)pIVar8->Width + fVar1,(float)pIVar8->Height + fVar22,local_48.x
                       ,local_48.y,local_50.x,local_50.y,pIVar8->GlyphAdvanceX);
    }
    iVar13 = iVar13 + 1;
  } while( true );
}

Assistant:

void ImFontAtlasBuildFinish(ImFontAtlas* atlas)
{
    // Render into our custom data blocks
    IM_ASSERT(atlas->TexPixelsAlpha8 != NULL || atlas->TexPixelsRGBA32 != NULL);
    ImFontAtlasBuildRenderDefaultTexData(atlas);
    ImFontAtlasBuildRenderLinesTexData(atlas);

    // Register custom rectangle glyphs
    for (int i = 0; i < atlas->CustomRects.Size; i++)
    {
        const ImFontAtlasCustomRect* r = &atlas->CustomRects[i];
        if (r->Font == NULL || r->GlyphID == 0)
            continue;

        // Will ignore ImFontConfig settings: GlyphMinAdvanceX, GlyphMinAdvanceY, GlyphExtraSpacing, PixelSnapH
        IM_ASSERT(r->Font->ContainerAtlas == atlas);
        ImVec2 uv0, uv1;
        atlas->CalcCustomRectUV(r, &uv0, &uv1);
        r->Font->AddGlyph(NULL, (ImWchar)r->GlyphID, r->GlyphOffset.x, r->GlyphOffset.y, r->GlyphOffset.x + r->Width, r->GlyphOffset.y + r->Height, uv0.x, uv0.y, uv1.x, uv1.y, r->GlyphAdvanceX);
    }

    // Build all fonts lookup tables
    for (int i = 0; i < atlas->Fonts.Size; i++)
        if (atlas->Fonts[i]->DirtyLookupTables)
            atlas->Fonts[i]->BuildLookupTable();

    atlas->TexReady = true;
}